

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void CVmImageLoader::load_resources_from_fp(osfildef *fp,char *fname,CVmHostIfc *hostifc)

{
  void *pvVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *in_RDX;
  undefined8 in_RSI;
  CVmImageLoaderMres *in_stack_00000010;
  char *in_stack_00000018;
  err_frame_t err_cur__;
  CVmImageLoaderMres_std res_ifc;
  int fileno;
  CVmHostIfc *in_stack_fffffffffffffed0;
  undefined8 uVar4;
  int in_stack_fffffffffffffedc;
  CVmImageLoaderMres_std *in_stack_fffffffffffffee0;
  uint local_118 [2];
  undefined8 local_110;
  void *local_108;
  __jmp_buf_tag _Stack_100;
  undefined4 local_1c;
  
  local_1c = (**(code **)(*in_RDX + 0x50))(in_RDX,in_RSI);
  CVmImageLoaderMres_std::CVmImageLoaderMres_std
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0);
  puVar2 = (undefined8 *)_ZTW11G_err_frame();
  local_110 = *puVar2;
  plVar3 = (long *)_ZTW11G_err_frame();
  *plVar3 = (long)local_118;
  local_118[0] = _setjmp(&_Stack_100);
  if (local_118[0] == 0) {
    load_resources_from_fp((osfildef *)err_cur__._0_8_,in_stack_00000018,in_stack_00000010);
  }
  if (local_118[0] == 1) {
    local_118[0] = 2;
  }
  uVar4 = local_110;
  puVar2 = (undefined8 *)_ZTW11G_err_frame();
  *puVar2 = uVar4;
  if ((local_118[0] & 0x4001) != 0) {
    puVar2 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar2 & 2) != 0) {
      plVar3 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar3 + 0x10));
    }
    pvVar1 = local_108;
    plVar3 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar3 + 0x10) = pvVar1;
    err_rethrow();
  }
  if ((local_118[0] & 2) != 0) {
    free(local_108);
  }
  CVmImageLoaderMres_std::~CVmImageLoaderMres_std((CVmImageLoaderMres_std *)0x30baf6);
  return;
}

Assistant:

void CVmImageLoader::load_resources_from_fp(osfildef *fp,
                                            const char *fname,
                                            CVmHostIfc *hostifc)
{
    int fileno;

    /* ask the host system to assign a number to the file */
    fileno = hostifc->add_resfile(fname);

    /* set up a resource interface with the file number */
    CVmImageLoaderMres_std res_ifc(fileno, hostifc);

    err_try
    {
        /* load the resources */
        load_resources_from_fp(fp, fname, &res_ifc);
    }